

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef lj_record_constify(jit_State *J,cTValue *o)

{
  cTValue *o_local;
  jit_State *J_local;
  undefined4 local_2c;
  undefined4 local_1c;
  undefined4 local_c;
  
  if (((int)(o->field_4).it >> 0xf) + 4U < 0xfffffff7) {
    if ((uint)((int)(o->field_4).it >> 0xf) < 0xfffffff2) {
      J_local._4_4_ = lj_ir_knumint(J,o->n);
    }
    else if (((int)(o->field_4).it >> 0xf == -2) || ((int)(o->field_4).it >> 0xf == -3)) {
      if ((uint)((int)(o->field_4).it >> 0xf) < 0xfffffff2) {
        local_1c = 0xe;
      }
      else {
        local_1c = (int)(o->field_4).it >> 0xf ^ 0xffffffff;
      }
      if ((uint)((int)(o->field_4).it >> 0xf) < 0xfffffff2) {
        local_2c = 0xe;
      }
      else {
        local_2c = (int)(o->field_4).it >> 0xf ^ 0xffffffff;
      }
      J_local._4_4_ = (0x7fff - local_1c) + local_2c * 0x1000000;
    }
    else {
      J_local._4_4_ = 0;
    }
  }
  else {
    if ((uint)((int)(o->field_4).it >> 0xf) < 0xfffffff2) {
      local_c = IRT_NUM;
    }
    else {
      local_c = (int)(o->field_4).it >> 0xf ^ ~IRT_NIL;
    }
    J_local._4_4_ = lj_ir_kgc(J,(GCobj *)(o->u64 & 0x7fffffffffff),local_c);
  }
  return J_local._4_4_;
}

Assistant:

TRef lj_record_constify(jit_State *J, cTValue *o)
{
  if (tvisgcv(o))
    return lj_ir_kgc(J, gcV(o), itype2irt(o));
  else if (tvisint(o))
    return lj_ir_kint(J, intV(o));
  else if (tvisnum(o))
    return lj_ir_knumint(J, numV(o));
  else if (tvisbool(o))
    return TREF_PRI(itype2irt(o));
  else
    return 0;  /* Can't represent lightuserdata (pointless). */
}